

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O0

boolean decode_mcu_AC_first(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  jpeg_entropy_decoder *pjVar3;
  int *piVar4;
  JBLOCKROW paJVar5;
  d_derived_tbl *htbl;
  boolean bVar6;
  int nbits;
  uint uVar7;
  uint local_9c;
  int local_94;
  int look;
  int nb;
  d_derived_tbl *tbl;
  bitread_working_state br_state;
  _func_void_j_decompress_ptr *p_Stack_58;
  int bits_left;
  bit_buf_type get_buffer;
  JBLOCKROW block;
  int *natural_order;
  int Al;
  int Se;
  uint EOBRUN;
  int r;
  int k;
  int s;
  huff_entropy_ptr entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->entropy;
  if (((cinfo->restart_interval == 0) || (*(int *)&pjVar3[3].decode_mcu != 0)) ||
     (bVar6 = process_restart(cinfo), bVar6 != 0)) {
    if (*(int *)((long)&pjVar3[3].start_pass + 4) == 0) {
      iVar1 = cinfo->Se;
      iVar2 = cinfo->Al;
      piVar4 = cinfo->natural_order;
      if (*(int *)&pjVar3[2].start_pass == 0) {
        tbl = (d_derived_tbl *)cinfo->src->next_input_byte;
        br_state.next_input_byte = (JOCTET *)cinfo->src->bytes_in_buffer;
        p_Stack_58 = pjVar3[1].start_pass;
        br_state.cinfo._4_4_ = *(int *)&pjVar3[1].decode_mcu;
        paJVar5 = *MCU_data;
        htbl = (d_derived_tbl *)pjVar3[6].start_pass;
        br_state._24_8_ = cinfo;
        for (EOBRUN = cinfo->Ss; Al = 0, (int)EOBRUN <= iVar1; EOBRUN = EOBRUN + 1) {
          if (br_state.cinfo._4_4_ < 8) {
            bVar6 = jpeg_fill_bit_buffer
                              ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_58,
                               br_state.cinfo._4_4_,0);
            if (bVar6 == 0) {
              return 0;
            }
            p_Stack_58 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            if (7 < (int)br_state.get_buffer) goto LAB_0039a087;
            local_94 = 1;
LAB_0039a0f5:
            r = jpeg_huff_decode((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_58,
                                 br_state.cinfo._4_4_,htbl,local_94);
            if (r < 0) {
              return 0;
            }
            p_Stack_58 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
            br_state.cinfo._4_4_ = (int)br_state.get_buffer;
          }
          else {
LAB_0039a087:
            uVar7 = (uint)((long)p_Stack_58 >> ((char)br_state.cinfo._4_4_ - 8U & 0x3f)) & 0xff;
            if (htbl->look_nbits[(int)uVar7] == 0) {
              local_94 = 9;
              goto LAB_0039a0f5;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - htbl->look_nbits[(int)uVar7];
            r = (int)htbl->look_sym[(int)uVar7];
          }
          nbits = r >> 4;
          uVar7 = r & 0xf;
          if (uVar7 == 0) {
            if (nbits != 0xf) {
              Al = 1 << ((byte)nbits & 0x1f);
              if (nbits != 0) {
                if (br_state.cinfo._4_4_ < nbits) {
                  bVar6 = jpeg_fill_bit_buffer
                                    ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_58,
                                     br_state.cinfo._4_4_,nbits);
                  if (bVar6 == 0) {
                    return 0;
                  }
                  p_Stack_58 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
                  br_state.cinfo._4_4_ = (int)br_state.get_buffer;
                }
                br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - nbits;
                Al = ((uint)((long)p_Stack_58 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) & bmask[nbits]
                     ) + Al;
              }
              Al = Al + -1;
              break;
            }
            EOBRUN = EOBRUN + 0xf;
          }
          else {
            EOBRUN = nbits + EOBRUN;
            if (br_state.cinfo._4_4_ < (int)uVar7) {
              bVar6 = jpeg_fill_bit_buffer
                                ((bitread_working_state *)&tbl,(bit_buf_type)p_Stack_58,
                                 br_state.cinfo._4_4_,uVar7);
              if (bVar6 == 0) {
                return 0;
              }
              p_Stack_58 = (_func_void_j_decompress_ptr *)br_state.bytes_in_buffer;
              br_state.cinfo._4_4_ = (int)br_state.get_buffer;
            }
            br_state.cinfo._4_4_ = br_state.cinfo._4_4_ - uVar7;
            local_9c = (uint)((long)p_Stack_58 >> ((byte)br_state.cinfo._4_4_ & 0x3f)) &
                       bmask[(int)uVar7];
            if ((int)local_9c <= bmask[(int)(uVar7 - 1)]) {
              local_9c = local_9c - bmask[(int)uVar7];
            }
            (*paJVar5)[piVar4[(int)EOBRUN]] = (JCOEF)(local_9c << ((byte)iVar2 & 0x1f));
          }
        }
        cinfo->src->next_input_byte = (JOCTET *)tbl;
        cinfo->src->bytes_in_buffer = (size_t)br_state.next_input_byte;
        pjVar3[1].start_pass = p_Stack_58;
        *(int *)&pjVar3[1].decode_mcu = br_state.cinfo._4_4_;
      }
      else {
        Al = *(int *)&pjVar3[2].start_pass + -1;
      }
      *(int *)&pjVar3[2].start_pass = Al;
    }
    *(int *)&pjVar3[3].decode_mcu = *(int *)&pjVar3[3].decode_mcu + -1;
    cinfo_local._4_4_ = 1;
  }
  else {
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_first (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{   
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  register int s, k, r;
  unsigned int EOBRUN;
  int Se, Al;
  const int * natural_order;
  JBLOCKROW block;
  BITREAD_STATE_VARS;
  d_derived_tbl * tbl;

  /* Process restart marker if needed; may have to suspend */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      if (! process_restart(cinfo))
	return FALSE;
  }

  /* If we've run out of data, just leave the MCU set to zeroes.
   * This way, we return uniform gray for the remainder of the segment.
   */
  if (! entropy->insufficient_data) {

    Se = cinfo->Se;
    Al = cinfo->Al;
    natural_order = cinfo->natural_order;

    /* Load up working state.
     * We can avoid loading/saving bitread state if in an EOB run.
     */
    EOBRUN = entropy->saved.EOBRUN;	/* only part of saved state we need */

    /* There is always only one block per MCU */

    if (EOBRUN > 0)		/* if it's a band of zeroes... */
      EOBRUN--;			/* ...process it now (we do nothing) */
    else {
      BITREAD_LOAD_STATE(cinfo,entropy->bitstate);
      block = MCU_data[0];
      tbl = entropy->ac_derived_tbl;

      for (k = cinfo->Ss; k <= Se; k++) {
	HUFF_DECODE(s, br_state, tbl, return FALSE, label2);
	r = s >> 4;
	s &= 15;
	if (s) {
	  k += r;
	  CHECK_BIT_BUFFER(br_state, s, return FALSE);
	  r = GET_BITS(s);
	  s = HUFF_EXTEND(r, s);
	  /* Scale and output coefficient in natural (dezigzagged) order */
	  (*block)[natural_order[k]] = (JCOEF) (s << Al);
	} else {
	  if (r == 15) {	/* ZRL */
	    k += 15;		/* skip 15 zeroes in band */
	  } else {		/* EOBr, run length is 2^r + appended bits */
	    EOBRUN = 1 << r;
	    if (r) {		/* EOBr, r > 0 */
	      CHECK_BIT_BUFFER(br_state, r, return FALSE);
	      r = GET_BITS(r);
	      EOBRUN += r;
	    }
	    EOBRUN--;		/* this band is processed at this moment */
	    break;		/* force end-of-band */
	  }
	}
      }

      BITREAD_SAVE_STATE(cinfo,entropy->bitstate);
    }

    /* Completed MCU, so update state */
    entropy->saved.EOBRUN = EOBRUN;	/* only part of saved state we need */
  }

  /* Account for restart interval (no-op if not using restarts) */
  entropy->restarts_to_go--;

  return TRUE;
}